

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetanimator.cpp
# Opt level: O1

void __thiscall
QWidgetAnimator::animate(QWidgetAnimator *this,QWidget *widget,QRect *_final_geometry,bool animate)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidgetData *pQVar5;
  long lVar6;
  int *piVar7;
  bool bVar8;
  bool bVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  QRect QVar14;
  QWidget *pQVar15;
  int iVar16;
  QStyle *pQVar17;
  QPropertyAnimation *this_00;
  ulong uVar18;
  undefined8 uVar19;
  undefined4 *puVar20;
  undefined7 in_register_00000009;
  long lVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  int iVar25;
  long in_FS_OFFSET;
  bool bVar26;
  const_iterator cVar27;
  undefined1 auVar28 [16];
  code *local_b0;
  ImplFn local_a8;
  QObject local_a0 [8];
  QRect local_98;
  QWidget *widget_local;
  anon_union_24_3_e3d07ef4_for_data local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = widget->data;
  iVar16 = (pQVar5->crect).x1.m_i;
  uVar22 = (pQVar5->crect).x2.m_i;
  uVar23 = (pQVar5->crect).y2.m_i;
  if ((int)(uVar22 | uVar23) < 0) {
    uVar22 = 0xffffffff;
    iVar24 = 0;
    uVar23 = 0xffffffff;
    iVar25 = 0;
  }
  else {
    iVar24 = (pQVar5->crect).y1.m_i;
    iVar25 = iVar16;
  }
  if ((animate) && ((uVar22 != iVar25 - 1U || (uVar23 != iVar24 - 1U)))) {
    uVar1 = _final_geometry->x1;
    uVar3 = _final_geometry->y1;
    uVar2 = _final_geometry->x2;
    uVar4 = _final_geometry->y2;
    auVar28._0_4_ = -(uint)(uVar2 == uVar1 + -1);
    iVar24 = -(uint)(uVar4 == uVar3 + -1);
    auVar28._4_4_ = auVar28._0_4_;
    auVar28._8_4_ = iVar24;
    auVar28._12_4_ = iVar24;
    movmskpd((int)CONCAT71(in_register_00000009,animate),auVar28);
  }
  if ((((_final_geometry->x2).m_i < (_final_geometry->x1).m_i) ||
      ((_final_geometry->y2).m_i < (_final_geometry->y1).m_i)) &&
     (((pQVar5->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
    local_98.x1.m_i = ~(pQVar5->crect).x2.m_i + iVar16 + -500;
    local_98.y1.m_i = ((pQVar5->crect).y1.m_i - (pQVar5->crect).y2.m_i) + -0x1f5;
    local_98.x2.m_i = -0x1f5;
    local_98.y2.m_i = -0x1f5;
  }
  else {
    uVar10 = _final_geometry->x1;
    uVar11 = _final_geometry->y1;
    uVar12 = _final_geometry->x2;
    uVar13 = _final_geometry->y2;
    local_98.x1.m_i = uVar10;
    local_98.y1.m_i = uVar11;
    local_98.x2.m_i = uVar12;
    local_98.y2.m_i = uVar13;
  }
  widget_local = widget;
  pQVar17 = QWidget::style(widget);
  iVar16 = (**(code **)(*(long *)pQVar17 + 0xf0))(pQVar17,0x71,0,widget_local,0);
  if (iVar16 == 0) {
    QWidget::setGeometry(widget_local,&local_98);
    QMainWindowLayout::animationFinished(*(QMainWindowLayout **)(this + 0x18),widget_local);
    goto LAB_00396814;
  }
  cVar27 = QHash<QWidget*,QPointer<QPropertyAnimation>>::constFindImpl<QWidget*>
                     ((QHash<QWidget*,QPointer<QPropertyAnimation>> *)(this + 0x10),&widget_local);
  bVar8 = cVar27.i.d == (Data<QHashPrivate::Node<QWidget_*,_QPointer<QPropertyAnimation>_>_> *)0x0;
  bVar9 = cVar27.i.bucket == 0;
  if (bVar8 && bVar9) {
LAB_00396611:
    bVar26 = false;
  }
  else {
    QVariantAnimation::endValue();
    auVar28 = ::QVariant::toRect();
    bVar26 = false;
    if ((local_98.x1.m_i == auVar28._0_4_) && (bVar26 = false, local_98.x2.m_i == auVar28._8_4_)) {
      if (local_98.y1.m_i != auVar28._4_4_) goto LAB_00396611;
      bVar26 = local_98.y2.m_i == auVar28._12_4_;
    }
  }
  if (!bVar8 || !bVar9) {
    ::QVariant::~QVariant(&local_58);
  }
  if (!bVar26) {
    this_00 = (QPropertyAnimation *)operator_new(0x10);
    pQVar15 = widget_local;
    QByteArray::QByteArray((QByteArray *)&local_78,"geometry",-1);
    QPropertyAnimation::QPropertyAnimation
              (this_00,&pQVar15->super_QObject,(QByteArray *)&local_78,&widget_local->super_QObject)
    ;
    if ((QArrayData *)local_78.shared != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_78.shared = *(int *)local_78.shared + -1;
      UNLOCK();
      if (*(int *)local_78.shared == 0) {
        QArrayData::deallocate((QArrayData *)local_78.shared,1,0x10);
      }
    }
    QVariantAnimation::setDuration((DeletionPolicy)this_00);
    QEasingCurve::QEasingCurve((QEasingCurve *)&local_78,InOutQuad);
    QVariantAnimation::setEasingCurve((QEasingCurve *)this_00);
    QEasingCurve::~QEasingCurve((QEasingCurve *)&local_78);
    QVar14.y1.m_i = local_98.y1.m_i;
    QVar14.x1.m_i = local_98.x1.m_i;
    QVar14.x2.m_i = local_98.x2.m_i;
    QVar14.y2.m_i = local_98.y2.m_i;
    ::QVariant::QVariant((QVariant *)&local_78,QVar14);
    QVariantAnimation::setEndValue((QVariant *)this_00);
    ::QVariant::~QVariant((QVariant *)&local_78);
    QHash<QWidget*,QPointer<QPropertyAnimation>>::tryEmplace_impl<QWidget*const&>
              ((TryEmplaceResult *)&local_78,
               (QHash<QWidget*,QPointer<QPropertyAnimation>> *)(this + 0x10),&widget_local);
    lVar21 = ((ulong)local_78._8_8_ >> 7) * 0x90;
    lVar6 = *(long *)(*(long *)(local_78.shared + 0x20) + 0x80 + lVar21);
    uVar18 = (ulong)*(byte *)((ulong)((uint)local_78._8_8_ & 0x7f) +
                             *(long *)(local_78.shared + 0x20) + lVar21);
    uVar19 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this_00);
    piVar7 = *(int **)(lVar6 + 8 + uVar18 * 0x18);
    *(undefined8 *)(lVar6 + 8 + uVar18 * 0x18) = uVar19;
    *(QPropertyAnimation **)(lVar6 + 0x10 + uVar18 * 0x18) = this_00;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        operator_delete(piVar7);
      }
    }
    local_b0 = animationFinished;
    local_a8 = (ImplFn)0x0;
    local_78.shared = (PrivateShared *)QAbstractAnimation::finished;
    local_78._8_8_ = (char *)0x0;
    puVar20 = (undefined4 *)operator_new(0x20);
    *puVar20 = 1;
    *(code **)(puVar20 + 2) =
         QtPrivate::QCallableObject<void_(QWidgetAnimator::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar20 + 4) = animationFinished;
    *(undefined8 *)(puVar20 + 6) = 0;
    QObject::connectImpl
              (local_a0,(void **)this_00,(QObject *)&local_78,(void **)this,
               (QSlotObjectBase *)&local_b0,(ConnectionType)puVar20,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_a0);
    QAbstractAnimation::start((DeletionPolicy)this_00);
  }
LAB_00396814:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetAnimator::animate(QWidget *widget, const QRect &_final_geometry, bool animate)
{
    QRect r = widget->geometry();
    if (r.right() < 0 || r.bottom() < 0)
        r = QRect();

    animate = animate && !r.isNull() && !_final_geometry.isNull();

    // might make the widget go away by sending it to negative space
    const QRect final_geometry = _final_geometry.isValid() || widget->isWindow() ? _final_geometry :
        QRect(QPoint(-500 - widget->width(), -500 - widget->height()), widget->size());

#if QT_CONFIG(animation)
    //If the QStyle has animations, animate
    if (const int animationDuration = widget->style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, widget)) {
        AnimationMap::const_iterator it = m_animation_map.constFind(widget);
        if (it != m_animation_map.constEnd() && (*it)->endValue().toRect() == final_geometry)
            return;

        QPropertyAnimation *anim = new QPropertyAnimation(widget, "geometry", widget);
        anim->setDuration(animate ? animationDuration : 0);
        anim->setEasingCurve(QEasingCurve::InOutQuad);
        anim->setEndValue(final_geometry);
        m_animation_map[widget] = anim;
        connect(anim, &QPropertyAnimation::finished,
                this, &QWidgetAnimator::animationFinished);
        anim->start(QPropertyAnimation::DeleteWhenStopped);
    } else
#endif // animation
    {
    //we do it in one shot
    widget->setGeometry(final_geometry);
#if QT_CONFIG(mainwindow)
    m_mainWindowLayout->animationFinished(widget);
#endif // QT_CONFIG(mainwindow)
    }
}